

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yocto_obj.h
# Opt level: O3

yo__vert * yo__parse_vert(yo__vert *__return_storage_ptr__,char *str,yo__vhash *vhash,yo__vert vl)

{
  int iVar1;
  yo__vert *pyVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int *piVar6;
  char *pcVar7;
  ulong uVar8;
  size_t __size;
  ulong uVar9;
  int i;
  long lVar10;
  char *splits [5];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  char *local_48 [5];
  
  local_48[1] = (char *)0x0;
  local_48[2] = (char *)0x0;
  local_48[3] = (char *)0x0;
  local_48[4] = (char *)0x0;
  local_48[0] = str;
  local_68 = 0xffffffffffffffff;
  uStack_60 = 0xffffffffffffffff;
  local_58 = (yo__vert *)0xffffffff;
  pcVar7 = str + 1;
  iVar1 = 1;
  do {
    if (pcVar7[-1] == '/') {
      pcVar7[-1] = '\0';
      if (iVar1 < 5) {
        lVar10 = (long)iVar1;
        iVar1 = iVar1 + 1;
        local_48[lVar10] = pcVar7;
      }
    }
    else if (pcVar7[-1] == '\0') break;
    pcVar7 = pcVar7 + 1;
  } while( true );
  lVar10 = 0;
  do {
    if (local_48[lVar10] == (char *)0x0) {
      *(undefined4 *)((long)&local_68 + lVar10 * 4) = 0xffffffff;
    }
    else {
      iVar1 = atoi(local_48[lVar10]);
      if (iVar1 < 0) {
        iVar1 = iVar1 + *(int *)((long)splits + lVar10 * 4 + -0x18);
      }
      else {
        iVar1 = iVar1 + -1;
      }
      *(int *)((long)&local_68 + lVar10 * 4) = iVar1;
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 5);
  iVar1 = (int)local_68 % 0x100000;
  uVar5 = vhash->s[iVar1];
  if (0 < (long)(int)uVar5) {
    piVar6 = &vhash->v[iVar1]->radius;
    uVar8 = 0xffffffff;
    uVar9 = 0;
    do {
      if (((((int)local_68 == ((yo__vert *)(piVar6 + -4))->pos) && (local_68._4_4_ == piVar6[-3]))
          && ((int)uStack_60 == piVar6[-2])) &&
         ((uStack_60._4_4_ == piVar6[-1] && ((int)local_58 == *piVar6)))) {
        uVar8 = uVar9 & 0xffffffff;
      }
      uVar9 = uVar9 + 1;
    } while ((uVar9 < (ulong)(long)(int)uVar5) && (piVar6 = piVar6 + 6, (int)uVar8 < 0));
    if (-1 < (int)uVar8) {
      local_58 = vhash->v[iVar1];
      iVar1 = local_58[uVar8].vid;
      __return_storage_ptr__->radius = local_58[uVar8].radius;
      __return_storage_ptr__->vid = iVar1;
      pyVar2 = local_58 + uVar8;
      local_68._0_4_ = pyVar2->pos;
      local_68._4_4_ = pyVar2->texcoord;
      uStack_60._0_4_ = pyVar2->norm;
      uStack_60._4_4_ = pyVar2->color;
      goto LAB_0016ff06;
    }
  }
  local_58 = (yo__vert *)CONCAT44(vhash->nverts,(int)local_58);
  if (uVar5 == 0xffffffff) {
    iVar4 = 0;
LAB_0016fe54:
    uVar3 = uVar5 - 1 >> 1 | uVar5 - 1;
    uVar3 = uVar3 >> 2 | uVar3;
    uVar3 = uVar3 >> 4 | uVar3;
    uVar3 = uVar3 >> 8 | uVar3;
    if ((int)((uVar3 >> 0x10 | uVar3) + 1) < iVar4) {
      pyVar2 = vhash->v[iVar1];
      if (uVar5 != 0xffffffff) goto LAB_0016fe90;
      __size = 0;
      goto LAB_0016febf;
    }
  }
  else {
    if (uVar5 != 0) {
      uVar3 = uVar5 >> 1 | uVar5;
      uVar3 = uVar3 >> 2 | uVar3;
      uVar3 = uVar3 >> 4 | uVar3;
      uVar3 = uVar3 >> 8 | uVar3;
      iVar4 = (uVar3 >> 0x10 | uVar3) + 1;
      goto LAB_0016fe54;
    }
    pyVar2 = vhash->v[iVar1];
LAB_0016fe90:
    uVar5 = uVar5 >> 1 | uVar5;
    uVar5 = uVar5 >> 2 | uVar5;
    uVar5 = uVar5 >> 4 | uVar5;
    uVar5 = uVar5 >> 8 | uVar5;
    __size = (long)(int)((uVar5 >> 0x10 | uVar5) + 1) * 0x18;
LAB_0016febf:
    pyVar2 = (yo__vert *)realloc(pyVar2,__size);
    vhash->v[iVar1] = pyVar2;
    uVar5 = vhash->s[iVar1];
  }
  pyVar2 = vhash->v[iVar1];
  *(yo__vert **)&pyVar2[(int)uVar5].radius = local_58;
  pyVar2 = pyVar2 + (int)uVar5;
  pyVar2->pos = (int)local_68;
  pyVar2->texcoord = local_68._4_4_;
  pyVar2->norm = (int)uStack_60;
  pyVar2->color = uStack_60._4_4_;
  vhash->s[iVar1] = vhash->s[iVar1] + 1;
  vhash->nverts = vhash->nverts + 1;
  *(yo__vert **)&__return_storage_ptr__->radius = local_58;
LAB_0016ff06:
  __return_storage_ptr__->pos = (int)local_68;
  __return_storage_ptr__->texcoord = local_68._4_4_;
  __return_storage_ptr__->norm = (int)uStack_60;
  __return_storage_ptr__->color = uStack_60._4_4_;
  return local_58;
}

Assistant:

static inline yo__vert
yo__parse_vert(char* str, yo__vhash* vhash, yo__vert vl) {
    // parse triplet
    char* splits[] = { str, 0, 0, 0, 0 };
    int ns = 1;
    yo__vert v = { -1, -1, -1, -1, -1 };
    while (*str) {
        if (*str == '/') {
            *str = 0;
            if (ns < 5) splits[ns++] = str + 1;
        }
        str++;
    }
    int* f = &v.pos;
    int* l = &vl.pos;
    for (int i = 0; i < 5; i++) {
        if (!splits[i]) {
            f[i] = -1;
            continue;
        }
        f[i] = (int)atoi(splits[i]);
        f[i] = (f[i] < 0) ? l[i] + f[i] : f[i] - 1;
    }

    // determine position vid using vertex hash
    int pos = -1;
    int hidx = v.pos % yo__vhash_size;
    for (int i = 0; i < vhash->s[hidx] && pos < 0; i++) {
        if (v.pos == vhash->v[hidx][i].pos &&
            v.texcoord == vhash->v[hidx][i].texcoord &&
            v.norm == vhash->v[hidx][i].norm &&
            v.color == vhash->v[hidx][i].color &&
            v.radius == vhash->v[hidx][i].radius)
            pos = i;
    }

    // found, can exit
    if (pos >= 0) return vhash->v[hidx][pos];

    // insert in vhash
    v.vid = vhash->nverts;
    yo__pushback(yo__vert, vhash->v[hidx], vhash->s[hidx], v);
    vhash->nverts++;

    return v;
}